

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps_compression.cpp
# Opt level: O0

void anon_unknown.dwarf_cde::toc(char *txt)

{
  ostream *poVar1;
  double dVar2;
  double ti;
  char *txt_local;
  
  dVar2 = timer::time_elapsed((timer *)(anonymous_namespace)::g_timer);
  poVar1 = std::operator<<((ostream *)&std::cout,txt);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  std::operator<<(poVar1," seconds.\n");
  return;
}

Assistant:

void toc(const char* txt)
    {
    double ti = g_timer.time_elapsed();
    std::cout << txt << ti << " seconds.\n";
    }